

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O3

bool __thiscall lan::db::declare(db *this,string *target,string *name,db_bit_type type)

{
  pointer pcVar1;
  bool bVar2;
  db_bits *context;
  invalid_argument *this_00;
  _Alloc_hider _Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar1 = (target->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + target->_M_string_length);
  context = find_rec(this,&local_70,Container,this->first);
  this->data = context;
  if (context != (db_bits *)0x0) {
    if (context->lin == (db_bit *)0x0) {
      paVar4 = &local_b0.field_2;
      pcVar1 = (name->_M_dataplus)._M_p;
      local_b0._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar1,pcVar1 + name->_M_string_length);
      bVar2 = init<int>(this,context,&local_b0,0,type);
      _Var3._M_p = local_b0._M_dataplus._M_p;
    }
    else {
      paVar4 = &local_90.field_2;
      pcVar1 = (name->_M_dataplus)._M_p;
      local_90._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar1,pcVar1 + name->_M_string_length);
      bVar2 = append<int>(this,context,&local_90,0,type);
      _Var3._M_p = local_90._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != paVar4) {
      operator_delete(_Var3._M_p,paVar4->_M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    return bVar2;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_d0,target,"{Container}");
  error_string(&local_50,(db *)target,_bit_name_error,&local_d0);
  std::invalid_argument::invalid_argument(this_00,(string *)&local_50);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool db::declare(std::string const target, std::string const name, db_bit_type const type){
            return ((data = find_rec(target, lan::Container, first)))
            ? (data->lin) ? append(data, name, 0, type) : init(data, name, 0, type): throw lan::errors::bit_name_error(error_string(errors::_private::_bit_name_error, target+("{Container}")));
        }